

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<pstack::Field<char[8],_elf_siginfo>,_char> *o)

{
  ostream *poVar1;
  JSON<elf_siginfo,_char> local_40;
  char local_29;
  JSON<char[8],_char> local_28;
  JSON<pstack::Field<char[8],_elf_siginfo>,_char> *local_18;
  JSON<pstack::Field<char[8],_elf_siginfo>,_char> *o_local;
  ostream *os_local;
  
  local_29 = '\0';
  local_18 = o;
  o_local = (JSON<pstack::Field<char[8],_elf_siginfo>,_char> *)os;
  local_28 = json<char[8],char>(o->object->k,&local_29);
  poVar1 = operator<<(os,&local_28);
  poVar1 = std::operator<<(poVar1,":");
  local_40 = json<elf_siginfo,char>(local_18->object->v,local_18->context);
  poVar1 = operator<<(poVar1,&local_40);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Field<K,V>, C> &o)
{
   return os << json(o.object.k) << ":" << json(o.object.v, o.context);
}